

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeCommLink.cpp
# Opt level: O0

char * xe::getCommLinkStateName(CommLinkState state)

{
  char *pcStack_10;
  CommLinkState state_local;
  
  switch(state) {
  case COMMLINKSTATE_READY:
    pcStack_10 = "COMMLINKSTATE_READY";
    break;
  case COMMLINKSTATE_TEST_PROCESS_LAUNCHING:
    pcStack_10 = "COMMLINKSTATE_PROCESS_LAUNCHING";
    break;
  case COMMLINKSTATE_TEST_PROCESS_RUNNING:
    pcStack_10 = "COMMLINKSTATE_PROCESS_RUNNING";
    break;
  case COMMLINKSTATE_TEST_PROCESS_FINISHED:
    pcStack_10 = "COMMLINKSTATE_FINISHED";
    break;
  case COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED:
    pcStack_10 = "COMMLINKSTATE_LAUNCH_FAILED";
    break;
  case COMMLINKSTATE_ERROR:
    pcStack_10 = "COMMLINKSTATE_ERROR";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getCommLinkStateName (CommLinkState state)
{
	switch (state)
	{
		case COMMLINKSTATE_READY:						return "COMMLINKSTATE_READY";
		case COMMLINKSTATE_TEST_PROCESS_LAUNCHING:		return "COMMLINKSTATE_PROCESS_LAUNCHING";
		case COMMLINKSTATE_TEST_PROCESS_RUNNING:		return "COMMLINKSTATE_PROCESS_RUNNING";
		case COMMLINKSTATE_TEST_PROCESS_FINISHED:		return "COMMLINKSTATE_FINISHED";
		case COMMLINKSTATE_TEST_PROCESS_LAUNCH_FAILED:	return "COMMLINKSTATE_LAUNCH_FAILED";
		case COMMLINKSTATE_ERROR:						return "COMMLINKSTATE_ERROR";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}